

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O1

string * __thiscall
duckdb::Bit::ToString_abi_cxx11_(string *__return_storage_ptr__,Bit *this,bitstring_t str)

{
  byte bVar1;
  void *pvVar2;
  char *output;
  long lVar3;
  bitstring_t bits;
  
  output = str.value._8_8_;
  if ((uint)this < 0xd) {
    bVar1 = (byte)((ulong)this >> 0x20);
  }
  else {
    bVar1 = *str.value._0_8_;
  }
  lVar3 = ((ulong)this & 0xffffffff) * 8 - (ulong)bVar1;
  pvVar2 = operator_new__(lVar3 - 8);
  bits.value.pointer.ptr = (char *)pvVar2;
  bits.value._0_8_ = str.value._0_8_;
  ToString(this,bits,output);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pvVar2,(long)pvVar2 + lVar3 + -8);
  operator_delete__(pvVar2);
  return __return_storage_ptr__;
}

Assistant:

string Bit::ToString(bitstring_t str) {
	auto len = BitLength(str);
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(len);
	ToString(str, buffer.get());
	return string(buffer.get(), len);
}